

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall
GraphTestImplicitOutputOutOfDate::GraphTestImplicitOutputOutOfDate
          (GraphTestImplicitOutputOutOfDate *this)

{
  GraphTestImplicitOutputOutOfDate *this_local;
  
  GraphTest::GraphTest(&this->super_GraphTest);
  (this->super_GraphTest).super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&PTR__GraphTestImplicitOutputOutOfDate_002632e8;
  return;
}

Assistant:

TEST_F(GraphTest, ImplicitOutputOutOfDate) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out | out.imp: cat in\n"));
  fs_.Create("out.imp", "");
  fs_.Tick();
  fs_.Create("in", "");
  fs_.Create("out", "");

  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("out"), &err));
  ASSERT_EQ("", err);

  EXPECT_TRUE(GetNode("out")->dirty());
  EXPECT_TRUE(GetNode("out.imp")->dirty());
}